

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

void ggml_set_i32_1d(ggml_tensor *tensor,int i,int32_t value)

{
  ggml_type gVar1;
  char cVar2;
  char *pcVar3;
  ushort uVar4;
  undefined8 uVar5;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  int64_t id [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 auStack_30 [2];
  undefined1 auVar8 [64];
  
  cVar2 = ggml_is_contiguous();
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM0_Qa;
  if (cVar2 == '\0') {
    local_48 = 0;
    uStack_40 = 0;
    uStack_38 = 0;
    auStack_30[0] = 0;
    ggml_unravel_index(tensor,(long)i,&local_48,&uStack_40,&uStack_38,auStack_30);
    ggml_set_i32_nd(tensor,(int)local_48,(int)uStack_40,(int)uStack_38,(int)auStack_30[0],value);
  }
  else {
    gVar1 = tensor->type;
    auVar7._4_12_ = auVar8._4_12_;
    switch(gVar1) {
    case GGML_TYPE_I8:
      if (tensor->nb[0] != 1) {
        pcVar3 = "tensor->nb[0] == sizeof(int8_t)";
        uVar5 = 0x3b8;
LAB_0010cd18:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,uVar5,"GGML_ASSERT(%s) failed",pcVar3);
      }
      *(char *)((long)tensor->data + (long)i) = (char)value;
      break;
    case GGML_TYPE_I16:
      if (tensor->nb[0] != 2) {
        pcVar3 = "tensor->nb[0] == sizeof(int16_t)";
        uVar5 = 0x3bd;
        goto LAB_0010cd18;
      }
      *(short *)((long)tensor->data + (long)i * 2) = (short)value;
      break;
    case GGML_TYPE_I32:
      if (tensor->nb[0] != 4) {
        pcVar3 = "tensor->nb[0] == sizeof(int32_t)";
        uVar5 = 0x3c2;
        goto LAB_0010cd18;
      }
      *(int32_t *)((long)tensor->data + (long)i * 4) = value;
      break;
    case GGML_TYPE_I64:
    case GGML_TYPE_F64:
    case GGML_TYPE_IQ1_M:
switchD_0010cb0a_caseD_1b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x3d6,"fatal error");
    case GGML_TYPE_BF16:
      if (tensor->nb[0] != 2) {
        pcVar3 = "tensor->nb[0] == sizeof(ggml_bf16_t)";
        uVar5 = 0x3cc;
        goto LAB_0010cd18;
      }
      fVar6 = (float)value;
      if ((uint)ABS(fVar6) < 0x7f800001) {
        uVar4 = (ushort)((int)fVar6 + 0x7fff + ((uint)fVar6 >> 0x10 & 1) >> 0x10);
      }
      else {
        uVar4 = (ushort)((uint)fVar6 >> 0x10) | 0x40;
      }
      *(ushort *)((long)tensor->data + (long)i * 2) = uVar4;
      break;
    default:
      if (gVar1 == GGML_TYPE_F32) {
        if (tensor->nb[0] != 4) {
          pcVar3 = "tensor->nb[0] == sizeof(float)";
          uVar5 = 0x3d1;
          goto LAB_0010cd18;
        }
        *(float *)((long)tensor->data + (long)i * 4) = (float)value;
      }
      else {
        if (gVar1 != GGML_TYPE_F16) goto switchD_0010cb0a_caseD_1b;
        if (tensor->nb[0] != 2) {
          pcVar3 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
          uVar5 = 0x3c7;
          goto LAB_0010cd18;
        }
        auVar7._0_4_ = (float)value;
        auVar7 = vcvtps2ph_f16c(auVar7,0);
        vpextrw_avx(auVar7,0);
      }
    }
  }
  return;
}

Assistant:

void ggml_set_i32_1d(const struct ggml_tensor * tensor, int i, int32_t value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_i32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_bf16_t));
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}